

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int BuildMapBitdepth16To8(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  
  if (img->Bitdepth16To8 == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->Bitdepth16To8 = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      iVar3 = 0;
      TIFFErrorExtR(img->tif,"BuildMapBitdepth16To8","Out of memory");
    }
    else {
      lVar2 = 0;
      do {
        puVar1[lVar2] = (uint8_t)((ulong)((int)lVar2 + 0x80) * 0xff00ff01 >> 0x28);
        lVar2 = lVar2 + 1;
      } while ((int)lVar2 != 0x10000);
      iVar3 = 1;
    }
    return iVar3;
  }
  __assert_fail("img->Bitdepth16To8 == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc65,"int BuildMapBitdepth16To8(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapBitdepth16To8(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapBitdepth16To8";
    uint8_t *m;
    uint32_t n;
    assert(img->Bitdepth16To8 == NULL);
    img->Bitdepth16To8 = _TIFFmallocExt(img->tif, 65536);
    if (img->Bitdepth16To8 == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->Bitdepth16To8;
    for (n = 0; n < 65536; n++)
        *m++ = (uint8_t)((n + 128) / 257);
    return (1);
}